

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt)

{
  xmlRegStateType xVar1;
  int tonr;
  xmlRegTrans *pxVar2;
  xmlRegStatePtr *ppxVar3;
  xmlRegStatePtr pxVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  xmlRegStatePtr pxVar12;
  xmlRegStatePtr pxVar13;
  long lVar14;
  int statenr;
  ulong uVar15;
  
  if (ctxt->states != (xmlRegStatePtr *)0x0) {
    for (uVar15 = 0; uVar9 = (ulong)ctxt->nbStates, (long)uVar15 < (long)uVar9; uVar15 = uVar15 + 1)
    {
      pxVar12 = ctxt->states[uVar15];
      if ((((((pxVar12 != (xmlRegStatePtr)0x0) && (pxVar12->nbTrans == 1)) &&
            (xVar1 = pxVar12->type, xVar1 != XML_REGEXP_FINAL_STATE)) &&
           ((xVar1 != XML_REGEXP_UNREACH_STATE &&
            (pxVar2 = pxVar12->trans, pxVar2->atom == (xmlRegAtomPtr)0x0)))) &&
          ((uVar9 = (ulong)(uint)pxVar2->to, uVar15 != uVar9 && -1 < pxVar2->to &&
           ((pxVar2->counter < 0 && (xVar1 != XML_REGEXP_START_STATE)))))) && (pxVar2->count < 0)) {
        for (lVar10 = 0; lVar10 < pxVar12->nbTransTo; lVar10 = lVar10 + 1) {
          pxVar13 = ctxt->states[pxVar12->transTo[lVar10]];
          lVar14 = 0x10;
          for (lVar11 = 0; lVar11 < pxVar13->nbTrans; lVar11 = lVar11 + 1) {
            pxVar2 = pxVar13->trans;
            if (uVar15 == *(uint *)((long)pxVar2 + lVar14 + -8)) {
              *(undefined4 *)((long)pxVar2 + lVar14 + -8) = 0xffffffff;
              xmlRegStateAddTrans(ctxt,pxVar13,*(xmlRegAtomPtr *)((long)pxVar2 + lVar14 + -0x10),
                                  ctxt->states[uVar9],*(int *)((long)pxVar2 + lVar14 + -4),
                                  *(int *)((long)&pxVar2->atom + lVar14));
            }
            lVar14 = lVar14 + 0x18;
          }
        }
        if (pxVar12->type == XML_REGEXP_FINAL_STATE) {
          ctxt->states[uVar9]->type = XML_REGEXP_FINAL_STATE;
        }
        pxVar12->nbTrans = 0;
        pxVar12->type = XML_REGEXP_UNREACH_STATE;
      }
    }
    for (lVar10 = 0; lVar10 < (int)uVar9; lVar10 = lVar10 + 1) {
      pxVar12 = ctxt->states[lVar10];
      if ((pxVar12 != (xmlRegStatePtr)0x0) && (pxVar12->type == XML_REGEXP_UNREACH_STATE)) {
        xmlRegFreeState(pxVar12);
        ctxt->states[lVar10] = (xmlRegStatePtr)0x0;
        uVar9 = (ulong)(uint)ctxt->nbStates;
      }
    }
    uVar9 = uVar9 & 0xffffffff;
    bVar6 = false;
    while (0 < (int)uVar9) {
      uVar9 = uVar9 - 1;
      pxVar12 = ctxt->states[uVar9 & 0xffffffff];
      if (pxVar12 != (xmlRegStatePtr)0x0) {
        iVar7 = pxVar12->nbTrans;
        if ((iVar7 == 0) && (pxVar12->type != XML_REGEXP_FINAL_STATE)) {
          pxVar12->type = XML_REGEXP_SINK_STATE;
        }
        lVar10 = 0x10;
        for (lVar14 = 0; lVar14 < iVar7; lVar14 = lVar14 + 1) {
          pxVar2 = pxVar12->trans;
          if ((*(long *)((long)pxVar2 + lVar10 + -0x10) == 0) &&
             (tonr = *(int *)((long)pxVar2 + lVar10 + -8), -1 < tonr)) {
            if (tonr == (int)uVar9) {
              *(undefined4 *)((long)pxVar2 + lVar10 + -8) = 0xffffffff;
            }
            else if (*(int *)((long)&pxVar2->atom + lVar10) < 0) {
              *(undefined4 *)((long)pxVar2 + lVar10 + -8) = 0xfffffffe;
              pxVar12->mark = XML_REGEXP_MARK_START;
              xmlFAReduceEpsilonTransitions
                        (ctxt,(int)uVar9,tonr,*(int *)((long)pxVar2 + lVar10 + -4));
              pxVar12->mark = XML_REGEXP_MARK_NORMAL;
              iVar7 = pxVar12->nbTrans;
              bVar6 = true;
            }
          }
          lVar10 = lVar10 + 0x18;
        }
      }
    }
    uVar8 = ctxt->nbStates;
    uVar15 = 0;
    if (0 < (int)uVar8) {
      uVar15 = (ulong)uVar8;
    }
    if (bVar6) {
      for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
        pxVar12 = ctxt->states[uVar9];
        if (pxVar12 != (xmlRegStatePtr)0x0) {
          uVar5 = pxVar12->nbTrans;
          if (pxVar12->nbTrans < 1) {
            uVar5 = 0;
          }
          for (lVar10 = 0; (ulong)uVar5 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
            pxVar2 = pxVar12->trans;
            if (((*(long *)((long)&pxVar2->atom + lVar10) == 0) &&
                (*(int *)((long)&pxVar2->count + lVar10) < 0)) &&
               (-1 < *(int *)((long)&pxVar2->to + lVar10))) {
              *(undefined4 *)((long)&pxVar2->to + lVar10) = 0xffffffff;
            }
          }
        }
      }
    }
    ppxVar3 = ctxt->states;
    for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
      if (ppxVar3[uVar9] != (xmlRegStatePtr)0x0) {
        ppxVar3[uVar9]->reached = XML_REGEXP_MARK_NORMAL;
      }
    }
    pxVar12 = *ppxVar3;
    if (pxVar12 != (xmlRegStatePtr)0x0) {
      pxVar12->reached = XML_REGEXP_MARK_START;
    }
LAB_0019bf1a:
    if (pxVar12 != (xmlRegStatePtr)0x0) {
      pxVar12->reached = XML_REGEXP_MARK_VISITED;
      uVar5 = pxVar12->nbTrans;
      if (pxVar12->nbTrans < 1) {
        uVar5 = 0;
      }
      pxVar13 = (xmlRegStatePtr)0x0;
      for (lVar10 = 0; (ulong)uVar5 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
        pxVar2 = pxVar12->trans;
        lVar14 = (long)*(int *)((long)&pxVar2->to + lVar10);
        if (((-1 < lVar14) &&
            ((*(long *)((long)&pxVar2->atom + lVar10) != 0 ||
             (-1 < *(int *)((long)&pxVar2->count + lVar10))))) &&
           ((pxVar4 = ppxVar3[lVar14], pxVar4 != (xmlRegStatePtr)0x0 &&
            (pxVar4->reached == XML_REGEXP_MARK_NORMAL)))) {
          pxVar4->reached = XML_REGEXP_MARK_START;
          pxVar13 = pxVar4;
        }
      }
      pxVar12 = pxVar13;
      lVar10 = 1;
      if (pxVar13 == (xmlRegStatePtr)0x0) {
        for (; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
          pxVar12 = ppxVar3[lVar10];
          if ((pxVar12 != (xmlRegStatePtr)0x0) && (pxVar12->reached == XML_REGEXP_MARK_START))
          goto LAB_0019bf1a;
        }
        pxVar12 = (xmlRegStatePtr)0x0;
      }
      goto LAB_0019bf1a;
    }
    for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
      pxVar12 = ctxt->states[lVar10];
      if ((pxVar12 != (xmlRegStatePtr)0x0) && (pxVar12->reached == XML_REGEXP_MARK_NORMAL)) {
        xmlRegFreeState(pxVar12);
        ctxt->states[lVar10] = (xmlRegStatePtr)0x0;
        uVar8 = ctxt->nbStates;
      }
    }
  }
  return;
}

Assistant:

static void
xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    int has_epsilon;

    if (ctxt->states == NULL) return;

    /*
     * Eliminate simple epsilon transition and the associated unreachable
     * states.
     */
    xmlFAEliminateSimpleEpsilonTransitions(ctxt);
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->type == XML_REGEXP_UNREACH_STATE)) {
#ifdef DEBUG_REGEXP_GRAPH
	    printf("Removed unreachable state %d\n", statenr);
#endif
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

    has_epsilon = 0;

    /*
     * Build the completed transitions bypassing the epsilons
     * Use a marking algorithm to avoid loops
     * Mark sink states too.
     * Process from the latest states backward to the start when
     * there is long cascading epsilon chains this minimize the
     * recursions and transition compares when adding the new ones
     */
    for (statenr = ctxt->nbStates - 1;statenr >= 0;statenr--) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if ((state->nbTrans == 0) &&
	    (state->type != XML_REGEXP_FINAL_STATE)) {
	    state->type = XML_REGEXP_SINK_STATE;
	}
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].atom == NULL) &&
		(state->trans[transnr].to >= 0)) {
		if (state->trans[transnr].to == statenr) {
		    state->trans[transnr].to = -1;
#ifdef DEBUG_REGEXP_GRAPH
		    printf("Removed loopback epsilon trans %d on %d\n",
			   transnr, statenr);
#endif
		} else if (state->trans[transnr].count < 0) {
		    int newto = state->trans[transnr].to;

#ifdef DEBUG_REGEXP_GRAPH
		    printf("Found epsilon trans %d from %d to %d\n",
			   transnr, statenr, newto);
#endif
		    has_epsilon = 1;
		    state->trans[transnr].to = -2;
		    state->mark = XML_REGEXP_MARK_START;
		    xmlFAReduceEpsilonTransitions(ctxt, statenr,
				      newto, state->trans[transnr].counter);
		    state->mark = XML_REGEXP_MARK_NORMAL;
#ifdef DEBUG_REGEXP_GRAPH
		} else {
		    printf("Found counted transition %d on %d\n",
			   transnr, statenr);
#endif
	        }
	    }
	}
    }
    /*
     * Eliminate the epsilon transitions
     */
    if (has_epsilon) {
	for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	    state = ctxt->states[statenr];
	    if (state == NULL)
		continue;
	    for (transnr = 0;transnr < state->nbTrans;transnr++) {
		xmlRegTransPtr trans = &(state->trans[transnr]);
		if ((trans->atom == NULL) &&
		    (trans->count < 0) &&
		    (trans->to >= 0)) {
		    trans->to = -1;
		}
	    }
	}
    }

    /*
     * Use this pass to detect unreachable states too
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state != NULL)
	    state->reached = XML_REGEXP_MARK_NORMAL;
    }
    state = ctxt->states[0];
    if (state != NULL)
	state->reached = XML_REGEXP_MARK_START;
    while (state != NULL) {
	xmlRegStatePtr target = NULL;
	state->reached = XML_REGEXP_MARK_VISITED;
	/*
	 * Mark all states reachable from the current reachable state
	 */
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].to >= 0) &&
		((state->trans[transnr].atom != NULL) ||
		 (state->trans[transnr].count >= 0))) {
		int newto = state->trans[transnr].to;

		if (ctxt->states[newto] == NULL)
		    continue;
		if (ctxt->states[newto]->reached == XML_REGEXP_MARK_NORMAL) {
		    ctxt->states[newto]->reached = XML_REGEXP_MARK_START;
		    target = ctxt->states[newto];
		}
	    }
	}

	/*
	 * find the next accessible state not explored
	 */
	if (target == NULL) {
	    for (statenr = 1;statenr < ctxt->nbStates;statenr++) {
		state = ctxt->states[statenr];
		if ((state != NULL) && (state->reached ==
			XML_REGEXP_MARK_START)) {
		    target = state;
		    break;
		}
	    }
	}
	state = target;
    }
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->reached == XML_REGEXP_MARK_NORMAL)) {
#ifdef DEBUG_REGEXP_GRAPH
	    printf("Removed unreachable state %d\n", statenr);
#endif
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

}